

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.h
# Opt level: O1

Relations dg::vr::RelationsAnalyzer::getCommonByPointedTo<unsigned_long>
                    (VectorSet<const_llvm::Value_*> *froms,
                    vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
                    *changeLocations,unsigned_long *val,Relations rels)

{
  VRLocation *pVVar1;
  bool bVar2;
  pointer ppVVar3;
  HandlePtr pBVar4;
  Relations RVar5;
  char cVar6;
  ulong uVar7;
  ulong uVar8;
  
  ppVVar3 = (changeLocations->
            super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (8 < (ulong)((long)(changeLocations->
                        super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar3)) {
    uVar7 = 1;
    uVar8 = 2;
    do {
      pVVar1 = ppVVar3[uVar7];
      pBVar4 = getCorrespondingByContent(&pVVar1->relations,froms);
      if (pBVar4 == (HandlePtr)0x0) {
        cVar6 = '\x01';
      }
      else {
        RVar5 = ValueRelations::_between
                          (&pVVar1->relations,
                           ((pBVar4->relatedBuckets)._M_elems[10].vec.
                            super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_data,*val);
        rels.bits.super__Base_bitset<1UL>._M_w =
             (bitset<12UL>)
             ((ulong)rels.bits.super__Base_bitset<1UL>._M_w &
             (ulong)RVar5.bits.super__Base_bitset<1UL>._M_w);
        cVar6 = (rels.bits.super__Base_bitset<1UL>._M_w == (_Base_bitset<1UL>)0x0) * '\x02';
      }
      if (cVar6 != '\0') goto LAB_00121d81;
      ppVVar3 = (changeLocations->
                super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      bVar2 = uVar8 < (ulong)((long)(changeLocations->
                                    super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar3 >> 3
                             );
      uVar7 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar2);
    cVar6 = '\x02';
LAB_00121d81:
    if (cVar6 != '\x02') {
      rels.bits.super__Base_bitset<1UL>._M_w = (bitset<12UL>)(bitset<12UL>)0;
    }
  }
  return (Relations)(_WordT)rels.bits.super__Base_bitset<1UL>._M_w;
}

Assistant:

static Relations
    getCommonByPointedTo(const VectorSet<V> &froms,
                         const std::vector<const VRLocation *> &changeLocations,
                         const X &val, Relations rels) {
        for (unsigned i = 1; i < changeLocations.size(); ++i) {
            const ValueRelations &graph = changeLocations[i]->relations;
            HandlePtr from = getCorrespondingByContent(graph, froms);
            if (!from)
                return Relations();
            assert(graph.hasLoad(*from));
            Handle loaded = graph.getPointedTo(*from);

            rels &= graph.between(loaded, val);
            if (!rels.any())
                break;
        }
        return rels;
    }